

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

void __thiscall MeCab::Writer::Writer(Writer *this)

{
  this->_vptr_Writer = (_func_int **)&PTR__Writer_00172f10;
  scoped_string::scoped_string(&this->node_format_);
  scoped_string::scoped_string(&this->bos_format_);
  scoped_string::scoped_string(&this->eos_format_);
  scoped_string::scoped_string(&this->unk_format_);
  scoped_string::scoped_string(&this->eon_format_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->what_);
  (this->what_).str_._M_dataplus._M_p = (pointer)&(this->what_).str_.field_2;
  (this->what_).str_._M_string_length = 0;
  (this->what_).str_.field_2._M_local_buf[0] = '\0';
  this->write_ = (offset_in_Writer_to_subr)writeLattice;
  *(undefined8 *)&this->field_0x1f8 = 0;
  return;
}

Assistant:

Writer::Writer() : write_(&Writer::writeLattice) {}